

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var10;
  int iVar11;
  uint uVar12;
  long lVar13;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar8 = *(uint *)&pjVar2[4].start_pass;
    if (uVar8 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar8 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar8 - 1;
  }
  lVar6 = 0;
  do {
    if (cinfo->blocks_in_MCU <= lVar6) {
      return 1;
    }
    lVar7 = (long)cinfo->MCU_membership[lVar6];
    iVar5 = (int)(*MCU_data[lVar6])[0] >> ((byte)cinfo->Al & 0x1f);
    iVar1 = cinfo->cur_comp_info[lVar7]->dc_tbl_no;
    p_Var10 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar7 * 4);
    iVar11 = iVar5 - *(int *)((long)&pjVar2[2].finish_pass + lVar7 * 4);
    if (iVar11 == 0) {
      arith_encode(cinfo,(uchar *)p_Var10,0);
      *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar7 * 4) = 0;
    }
    else {
      *(int *)((long)&pjVar2[2].finish_pass + lVar7 * 4) = iVar5;
      arith_encode(cinfo,(uchar *)p_Var10,1);
      uVar8 = 0;
      bVar3 = iVar11 < 1;
      if (bVar3) {
        iVar11 = -iVar11;
        lVar13 = 3;
        uVar4 = 8;
      }
      else {
        lVar13 = 2;
        uVar4 = 4;
      }
      arith_encode(cinfo,(uchar *)(p_Var10 + 1),(uint)bVar3);
      p_Var10 = p_Var10 + lVar13;
      *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar7 * 4) = uVar4;
      uVar12 = iVar11 - 1;
      if (uVar12 != 0) {
        uVar8 = 1;
        arith_encode(cinfo,(uchar *)p_Var10,1);
        p_Var10 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
        for (uVar9 = uVar12; 1 < uVar9; uVar9 = uVar9 >> 1) {
          arith_encode(cinfo,(uchar *)p_Var10,1);
          uVar8 = uVar8 * 2;
          p_Var10 = p_Var10 + 1;
        }
      }
      iVar5 = 0;
      arith_encode(cinfo,(uchar *)p_Var10,0);
      if ((int)uVar8 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_001267ec:
        *(int *)((long)&pjVar2[3].encode_mcu + lVar7 * 4) = iVar5;
      }
      else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar8) {
        iVar5 = *(int *)((long)&pjVar2[3].encode_mcu + lVar7 * 4) + 8;
        goto LAB_001267ec;
      }
      while (1 < uVar8) {
        uVar8 = (int)uVar8 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var10 + 0xe),(uint)((uVar8 & uVar12) != 0));
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2, temp3;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int)((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->last_dc_val[ci];
    entropy->last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */

    /* This is a well-known technique for obtaining the absolute value without
     * a branch.  It is derived from an assembly language technique presented
     * in "How to Optimize for the Pentium Processors", Copyright (c) 1996,
     * 1997 by Agner Fog.
     */
    temp3 = temp >> (CHAR_BIT * sizeof(int) - 1);
    temp ^= temp3;
    temp -= temp3;              /* temp is abs value of input */
    /* For a negative input, want temp2 = bitwise complement of abs(input) */
    temp2 = temp ^ temp3;

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = JPEG_NBITS(temp);
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS + 1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_symbol(entropy, compptr->dc_tbl_no, nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)                  /* emit_bits rejects calls with size 0 */
      emit_bits(entropy, (unsigned int)temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}